

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LzmaEnc.c
# Opt level: O2

SRes LzmaEnc_Encode(CLzmaEncHandle pp,ISeqOutStream *outStream,ISeqInStream *inStream,
                   ICompressProgress *progress,ISzAlloc *alloc,ISzAlloc *allocBig)

{
  SRes SVar1;
  CLzmaEnc *p;
  
  *(ISeqInStream **)((long)pp + 0x148) = inStream;
  *(undefined4 *)((long)pp + 0x90) = 1;
  *(ISeqOutStream **)((long)pp + 0xe8) = outStream;
  SVar1 = LzmaEnc_AllocAndInit((CLzmaEnc *)pp,0,alloc,allocBig);
  if (SVar1 != 0) {
    return SVar1;
  }
  SVar1 = LzmaEnc_Encode2((CLzmaEnc *)pp,progress);
  return SVar1;
}

Assistant:

SRes LzmaEnc_Encode(CLzmaEncHandle pp, ISeqOutStream *outStream, ISeqInStream *inStream, ICompressProgress *progress,
    ISzAlloc *alloc, ISzAlloc *allocBig)
{
  RINOK(LzmaEnc_Prepare(pp, outStream, inStream, alloc, allocBig));
  return LzmaEnc_Encode2((CLzmaEnc *)pp, progress);
}